

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O3

void OPN2_ChOutput(ym3438_t *chip)

{
  Bit8u BVar1;
  uint uVar2;
  short sVar3;
  uint uVar4;
  short sVar5;
  uint uVar6;
  short sVar7;
  uint uVar8;
  
  uVar2 = chip->cycles;
  BVar1 = chip->mode_test_2c[5];
  uVar4 = (uint)(ushort)chip->ch_lock;
  chip->ch_read = chip->ch_lock;
  uVar8 = chip->channel + (uint)(uVar2 < 0xc);
  uVar6 = uVar2 & 3;
  if (uVar6 == 0) {
    if (BVar1 == '\0') {
      uVar4 = (uint)(ushort)chip->ch_out[uVar8];
      chip->ch_lock = chip->ch_out[uVar8];
    }
    chip->ch_lock_l = chip->pan_l[uVar8];
    chip->ch_lock_r = chip->pan_r[uVar8];
  }
  if ((uVar2 & 0xfffffffc) == 4) {
    if (chip->dacen == '\0' && BVar1 == '\0') goto LAB_00170f60;
  }
  else if (BVar1 == '\0') goto LAB_00170f60;
  uVar4 = (uint)(int)(short)(chip->dacdata << 7) >> 7;
LAB_00170f60:
  chip->mol = 0;
  chip->mor = 0;
  sVar3 = (short)uVar4;
  if (((byte)chip_type & 1) == 0) {
    if (chip->ch_lock_l != '\0' && (uVar6 != 0 || BVar1 != '\0')) {
      chip->mol = sVar3;
    }
    if (chip->ch_lock_r == '\0' || uVar6 == 0 && BVar1 == '\0') {
      return;
    }
  }
  else {
    sVar7 = (short)((~uVar4 & 0xffff) >> 0xf);
    sVar3 = sVar3 + sVar7;
    sVar7 = sVar7 + (char)(uVar4 >> 8);
    sVar5 = sVar7;
    if (BVar1 != '\0') {
      sVar5 = sVar3;
    }
    if (uVar6 == 3) {
      sVar5 = sVar3;
    }
    sVar3 = sVar7;
    if (chip->ch_lock_l != '\0') {
      sVar3 = sVar5;
    }
    if (chip->ch_lock_r == '\0') {
      sVar5 = sVar7;
    }
    chip->mol = sVar3 * 3;
    sVar3 = sVar5 * 3;
  }
  chip->mor = sVar3;
  return;
}

Assistant:

void OPN2_ChOutput(ym3438_t *chip)
{
    Bit32u cycles = chip->cycles;
    Bit32u slot = chip->cycles;
    Bit32u channel = chip->channel;
    Bit32u test_dac = chip->mode_test_2c[5];
    Bit16s out;
    Bit16s sign;
    Bit32u out_en;
    chip->ch_read = chip->ch_lock;
    if (slot < 12)
    {
        /* Ch 4,5,6 */
        channel++;
    }
    if ((cycles & 3) == 0)
    {
        if (!test_dac)
        {
            /* Lock value */
            chip->ch_lock = chip->ch_out[channel];
        }
        chip->ch_lock_l = chip->pan_l[channel];
        chip->ch_lock_r = chip->pan_r[channel];
    }
    /* Ch 6 */
    if (((cycles >> 2) == 1 && chip->dacen) || test_dac)
    {
        out = (Bit16s)chip->dacdata;
        out <<= 7;
        out >>= 7;
    }
    else
    {
        out = chip->ch_lock;
    }
    chip->mol = 0;
    chip->mor = 0;

    if (chip_type & ym3438_mode_ym2612)
    {
        out_en = ((cycles & 3) == 3) || test_dac;
        /* YM2612 DAC emulation(not verified) */
        sign = out >> 8;
        if (out >= 0)
        {
            out++;
            sign++;
        }
        if (chip->ch_lock_l && out_en)
        {
            chip->mol = out;
        }
        else
        {
            chip->mol = sign;
        }
        if (chip->ch_lock_r && out_en)
        {
            chip->mor = out;
        }
        else
        {
            chip->mor = sign;
        }
        /* Amplify signal */
        chip->mol *= 3;
        chip->mor *= 3;
    }
    else
    {
        out_en = ((cycles & 3) != 0) || test_dac;
        if (chip->ch_lock_l && out_en)
        {
            chip->mol = out;
        }
        if (chip->ch_lock_r && out_en)
        {
            chip->mor = out;
        }
    }
}